

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::RemoveBoard(BasePort *this,uchar boardId)

{
  BoardIO *pBVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  int local_2c;
  int bd;
  BoardIO *board;
  uchar boardId_local;
  BasePort *this_local;
  
  if (boardId < 0x10) {
    pBVar1 = this->BoardList[boardId];
    if (pBVar1 == (BoardIO *)0x0) {
      poVar3 = std::operator<<(this->outStr,"BasePort::RemoveBoard: board not found: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)boardId);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      this->BoardInUseMask_ = this->BoardInUseMask_ & (1 << (boardId & 0x1f) ^ 0xffffffffU);
      (this->bcReadInfo).boardInfo[boardId].inUse = false;
      this->BoardList[boardId] = (BoardIO *)0x0;
      pBVar1->port = (BasePort *)0x0;
      this->NumOfBoards_ = this->NumOfBoards_ - 1;
      if (this->max_board - 1 <= (uint)boardId) {
        this->max_board = 0;
        for (local_2c = 0; local_2c < (int)(uint)boardId; local_2c = local_2c + 1) {
          if (this->BoardList[local_2c] != (BoardIO *)0x0) {
            this->max_board = local_2c + 1;
          }
        }
      }
      uVar2 = GetBroadcastReadSizeQuads(this);
      (this->bcReadInfo).readSizeQuads = uVar2;
      this_local._7_1_ = true;
    }
  }
  else {
    poVar3 = std::operator<<(this->outStr,"BasePort::RemoveBoard: board number out of range: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)boardId);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BasePort::RemoveBoard(unsigned char boardId)
{
    if (boardId >= BoardIO::MAX_BOARDS) {
        outStr << "BasePort::RemoveBoard: board number out of range: " << static_cast<unsigned int>(boardId) << std::endl;
        return false;
    }
    BoardIO *board = BoardList[boardId];
    if (!board) {
        outStr << "BasePort::RemoveBoard: board not found: " << static_cast<unsigned int>(boardId) << std::endl;
        return false;
    }

    // update BoardInuseMask_
    BoardInUseMask_ = (BoardInUseMask_ & (~(1 << boardId)));
    bcReadInfo.boardInfo[boardId].inUse = false;

    BoardList[boardId] = 0;
    board->port = 0;
    NumOfBoards_--;

    if (boardId >= max_board-1) {
        // If max_board was just removed, find the new max_board
        max_board = 0;
        for (int bd = 0; bd < boardId; bd++)
            if (BoardList[bd]) max_board = bd+1;
    }

    bcReadInfo.readSizeQuads = GetBroadcastReadSizeQuads();

    return true;
}